

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O3

void printDstIdx(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  cs_struct *pcVar3;
  
  pcVar3 = MI->csh;
  if (pcVar3->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x3e;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x5e] = MI->x86opsize;
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x4a;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x4e;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x52;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x56;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    pcVar3 = MI->csh;
  }
  if (pcVar3->mode == CS_MODE_64) {
    SStream_concat(O,"[");
  }
  else {
    SStream_concat(O,"es:[");
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46;
      puVar1[0] = '\x1c';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
  }
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = true;
  }
  printOperand(MI,Op,O);
  SStream_concat0(O,"]");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printDstIdx(MCInst *MI, unsigned Op, SStream *O)
{
	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;
	}

	// DI accesses are always ES-based on non-64bit mode
	if (MI->csh->mode != CS_MODE_64) {
		SStream_concat0(O, "%es:(");
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_ES;
		}
	} else
		SStream_concat0(O, "(");

	set_mem_access(MI, true);

	printOperand(MI, Op, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}